

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_storage.cpp
# Opt level: O0

pair<libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
libtorrent::aux::posix_storage::move_storage
          (pair<libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,posix_storage *this,string *sp,move_flags_t flags,
          storage_error *ec)

{
  file_storage *f;
  bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void> local_c8 [32];
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_boost::system::error_code_&)>
  local_a8;
  string local_88;
  pair<libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  anon_class_8_1_8991fb9c local_40;
  anon_class_8_1_8991fb9c move_partfile;
  status_t ret;
  storage_error *ec_local;
  move_flags_t flags_local;
  string *sp_local;
  posix_storage *this_local;
  
  libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>::
  bitfield_flag((bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void> *)
                ((long)&move_partfile.this + 7));
  local_40.this = this;
  f = files(this);
  ::std::__cxx11::string::string((string *)&local_88,(string *)&this->m_save_path);
  ::std::function<void(std::__cxx11::string_const&,boost::system::error_code&)>::
  function<libtorrent::aux::posix_storage::move_storage(std::__cxx11::string_const&,libtorrent::move_flags_t,libtorrent::storage_error&)::__0,void>
            ((function<void(std::__cxx11::string_const&,boost::system::error_code&)> *)&local_a8,
             &local_40);
  aux::move_storage(&local_68,f,&local_88,sp,&local_a8,flags,ec);
  ::std::
  tie<libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::disk_storage_status_tag,void>,std::__cxx11::string>
            (local_c8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&move_partfile.this + 7));
  ::std::
  tuple<libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::disk_storage_status_tag,void>&,std::__cxx11::string&>
  ::operator=((tuple<libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::disk_storage_status_tag,void>&,std::__cxx11::string&>
               *)local_c8,&local_68);
  ::std::
  pair<libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_68);
  ::std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_boost::system::error_code_&)>
  ::~function(&local_a8);
  ::std::__cxx11::string::~string((string *)&local_88);
  stat_cache::clear(&this->m_stat_cache);
  ::std::
  pair<libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            (__return_storage_ptr__,
             (bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void> *)
             ((long)&move_partfile.this + 7),&this->m_save_path);
  return __return_storage_ptr__;
}

Assistant:

std::pair<status_t, std::string> posix_storage::move_storage(std::string const& sp
		, move_flags_t const flags, storage_error& ec)
	{
		lt::status_t ret{};
		auto move_partfile = [&](std::string const& new_save_path, error_code& e)
		{
			if (!m_part_file) return;
			m_part_file->move_partfile(new_save_path, e);
		};
		std::tie(ret, m_save_path) = aux::move_storage(files(), m_save_path, sp
			, std::move(move_partfile), flags, ec);

		// clear the stat cache in case the new location has new files
		m_stat_cache.clear();

		return { ret, m_save_path };
	}